

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_relation.cpp
# Opt level: O1

void __thiscall duckdb::QueryRelation::~QueryRelation(QueryRelation *this)

{
  ~QueryRelation(this);
  operator_delete(this);
  return;
}

Assistant:

QueryRelation::~QueryRelation() {
}